

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall QAbstractSpinBox::setReadOnly(QAbstractSpinBox *this,bool enable)

{
  QAbstractSpinBoxPrivate *pQVar1;
  byte in_SIL;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QAbstractSpinBoxPrivate *d;
  QEvent event;
  QWidget *in_stack_ffffffffffffffb8;
  QLineEdit *in_stack_ffffffffffffffc8;
  QEvent *this_00;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QAbstractSpinBox *)0x685163);
  *(ushort *)&pQVar1->field_0x3d0 =
       ((ushort)*(undefined4 *)&pQVar1->field_0x3d0 & 0xfffd) + (ushort)(in_SIL & 1) * 2;
  QLineEdit::setReadOnly(in_stack_ffffffffffffffc8,SUB81((ulong)in_RDI >> 0x38,0));
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QEvent *)&local_18;
  QEvent::QEvent(this_00,ReadOnlyChange);
  QCoreApplication::sendEvent(in_RDI,this_00);
  QWidget::update(in_stack_ffffffffffffffb8);
  QEvent::~QEvent(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBox::setReadOnly(bool enable)
{
    Q_D(QAbstractSpinBox);
    d->readOnly = enable;
    d->edit->setReadOnly(enable);
    QEvent event(QEvent::ReadOnlyChange);
    QCoreApplication::sendEvent(this, &event);
    update();
}